

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidget::setDateRange(QCalendarWidget *this,QDate min,QDate max)

{
  QCalendarWidgetPrivate *this_00;
  QCalendarModel *this_01;
  long lVar1;
  QSpinBox *pQVar2;
  int iVar3;
  int month;
  long in_FS_OFFSET;
  QDate local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  this_01 = this_00->m_model;
  if ((this_01->m_minimumDate).jd == min.jd) {
    if ((0x16d3e147973 < min.jd + 0xb69eeff91fU) || ((this_01->m_maximumDate).jd == max.jd))
    goto LAB_003a8513;
  }
  else if (0x16d3e147973 < min.jd + 0xb69eeff91fU) goto LAB_003a8513;
  if (max.jd + 0xb69eeff91fU < 0x16d3e147974) {
    lVar1 = (this_01->m_date).jd;
    QtPrivate::QCalendarModel::setRange(this_01,min,max);
    pQVar2 = this_00->yearEdit;
    iVar3 = QDate::year(&this_00->m_model->m_minimumDate,
                        *(undefined8 *)&this_00->m_model->m_calendar);
    QSpinBox::setMinimum(pQVar2,iVar3);
    pQVar2 = this_00->yearEdit;
    iVar3 = QDate::year(&this_00->m_model->m_maximumDate,
                        *(undefined8 *)&this_00->m_model->m_calendar);
    QSpinBox::setMaximum(pQVar2,iVar3);
    QCalendarWidgetPrivate::updateMonthMenu(this_00);
    local_38.jd = (this_00->m_model->m_date).jd;
    if (lVar1 != local_38.jd) {
      QCalendarWidgetPrivate::update(this_00);
      iVar3 = QDate::year(&local_38,*(undefined8 *)&this_00->m_model->m_calendar);
      month = QDate::month(&local_38,*(undefined8 *)&this_00->m_model->m_calendar);
      QCalendarWidgetPrivate::showMonth(this_00,iVar3,month);
      (this_00->m_navigator->m_date).jd = local_38.jd;
      selectionChanged(this);
    }
  }
LAB_003a8513:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::setDateRange(QDate min, QDate max)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_minimumDate == min && d->m_model->m_maximumDate == max)
        return;
    if (!min.isValid() || !max.isValid())
        return;

    QDate oldDate = d->m_model->m_date;
    d->m_model->setRange(min, max);
    d->yearEdit->setMinimum(d->m_model->m_minimumDate.year(d->m_model->m_calendar));
    d->yearEdit->setMaximum(d->m_model->m_maximumDate.year(d->m_model->m_calendar));
    d->updateMonthMenu();
    QDate newDate = d->m_model->m_date;
    if (oldDate != newDate) {
        d->update();
        d->showMonth(newDate.year(d->m_model->m_calendar), newDate.month(d->m_model->m_calendar));
        d->m_navigator->setDate(newDate);
        emit selectionChanged();
    }
}